

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlb.c
# Opt level: O1

int lib_dlb_fread(char *buf,int size,int quan,dlb *dp)

{
  long *plVar1;
  long lVar2;
  size_t sVar3;
  size_t __size;
  
  lVar2 = dp->size - dp->mark;
  __size = (size_t)size;
  if (lVar2 < quan * size) {
    quan = (int)(lVar2 / (long)__size);
  }
  if (quan == 0) {
    sVar3 = 0;
  }
  else {
    lVar2 = dp->mark + dp->start;
    if (dp->lib->fmark != lVar2) {
      fseek((FILE *)dp->lib->fdata,lVar2,0);
      dp->lib->fmark = lVar2;
    }
    sVar3 = fread(buf,__size,(long)quan,(FILE *)dp->lib->fdata);
    dp->mark = dp->mark + __size * sVar3;
    plVar1 = &dp->lib->fmark;
    *plVar1 = *plVar1 + __size * sVar3;
  }
  return (int)sVar3;
}

Assistant:

static int lib_dlb_fread(char *buf, int size, int quan, dlb *dp)
{
    long pos, nread, nbytes;

    /* make sure we don't read into the next file */
    if ((dp->size - dp->mark) < (size * quan))
	quan = (dp->size - dp->mark) / size;
    if (quan == 0) return 0;

    pos = dp->start + dp->mark;
    if (dp->lib->fmark != pos) {
	fseek(dp->lib->fdata, pos, SEEK_SET);	/* check for error??? */
	dp->lib->fmark = pos;
    }

    nread = fread(buf, size, quan, dp->lib->fdata);
    nbytes = nread * size;
    dp->mark += nbytes;
    dp->lib->fmark += nbytes;

    return nread;
}